

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O1

void __thiscall
tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject
          (tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  long lVar2;
  long *plVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> QVar4;
  PromiseResolver<int> PVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> QVar6;
  _func_int **pp_Var7;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> QVar8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar9;
  char cVar10;
  bool bVar11;
  QPromise<int> *data;
  PromiseData<int> *pPVar12;
  QObject *pQVar13;
  int *piVar14;
  QEvent *this_00;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  PromiseData<QList<int>_> *this_01;
  ulong uVar18;
  long lVar19;
  QSharedData *pQVar20;
  char *reject;
  QByteArrayView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_120;
  PromiseResolver<int> resolver;
  _Manager_type local_108;
  PromiseResolver<QList<int>_> resolver_1;
  PromiseData<int> *local_e0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_d8;
  _Any_data local_d0;
  undefined **local_c0;
  PromiseData<int> *local_b8;
  undefined **local_b0;
  PromiseData<int> *local_a8;
  QPromise<QList<int>_> local_a0;
  qsizetype local_90;
  QPromise<QList<int>_> p;
  Type p1;
  Type p0;
  QArrayData *local_58;
  storage_type_conflict *psStack_50;
  qsizetype local_48;
  QSharedData *local_38;
  
  local_d0._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&p0,(int *)local_d0._M_pod_data);
  local_d0._0_4_ = 0x2c;
  QtPromise::resolve<int>((QtPromise *)&p1,(int *)local_d0._M_pod_data);
  pPVar12 = (PromiseData<int> *)operator_new(0x68);
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012dc60;
  QReadWriteLock::QReadWriteLock
            (&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0012dbf8;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar20 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar20 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_38 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_d0._M_unused._M_object = &PTR__QPromiseBase_0012dbc0;
  local_e0 = pPVar12;
  local_d0._8_8_ = pPVar12;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_d0);
  local_d0._M_unused._M_object = &PTR__QPromiseBase_0012d920;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_d0._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar20 = (QSharedData *)(local_d0._8_8_ + 8);
    (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_d0._8_8_ !=
        (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_d0._8_8_ + 8))();
    }
  }
  PVar5.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  pQVar13 = (QObject *)QThread::currentThread();
  if (pQVar13 == (QObject *)0x0) {
    piVar14 = (int *)0x0;
  }
  else {
    piVar14 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar13);
  }
  if (piVar14 != (int *)0x0) {
    if (((pQVar13 != (QObject *)0x0) && (piVar14[1] != 0)) &&
       (cVar10 = QThread::isFinished(), cVar10 == '\0')) {
      if (piVar14[1] == 0) {
        pQVar13 = (QObject *)(QThread *)0x0;
      }
      pQVar13 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar13);
      if ((pQVar13 != (QObject *)0x0) || (cVar10 = QCoreApplication::closingDown(), cVar10 == '\0'))
      {
        this_00 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(this_00,None);
        *(undefined ***)this_00 = &PTR__Event_0012d740;
        *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
         (this_00 + 0x10) = PVar5.m_d.d;
        if (PVar5.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar13,this_00,0);
      }
    }
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      operator_delete(piVar14);
    }
  }
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  local_d0._8_8_ = p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar20 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d0._M_unused._M_object = &PTR__QPromiseBase_0012dbc0;
  local_b8 = local_e0;
  LOCK();
  pQVar20 = &(local_e0->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_c0 = &PTR__QPromiseBase_0012dbc0;
  local_a8 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar20 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b0 = &PTR__QPromiseBase_0012dbc0;
  lVar15 = QArrayData::allocate((QArrayData **)&resolver,0x10,8,3,KeepSize);
  local_108 = (_Manager_type)0x0;
  uVar18 = 0xfffffffffffffff0;
  do {
    lVar19 = (long)local_108 * 0x10;
    *(undefined ***)(lVar15 + lVar19) = &PTR__QPromiseBase_0012d920;
    lVar2 = *(long *)((long)&local_b8 + uVar18);
    *(long *)(lVar15 + 8 + lVar19) = lVar2;
    if (lVar2 != 0) {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    local_108 = local_108 + 1;
    *(undefined ***)(lVar19 + lVar15) = &PTR__QPromiseBase_0012dbc0;
    uVar18 = uVar18 + 0x10;
  } while (uVar18 < 0x20);
  QtPromise::all<int,_QList>((QtPromise *)&p,(QList<QtPromise::QPromise<int>_> *)&resolver);
  QArrayDataPointer<QtPromise::QPromise<int>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<int>_> *)&resolver);
  lVar15 = 0x30;
  do {
    *(undefined ***)((long)&local_e0 + lVar15) = &PTR__QPromiseBase_0012d920;
    lVar2 = *(long *)((long)&local_d8.d + lVar15);
    if (lVar2 != 0) {
      LOCK();
      piVar14 = (int *)(lVar2 + 8);
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if ((*piVar14 == 0) &&
         (plVar3 = *(long **)((long)&local_d8.d + lVar15), plVar3 != (long *)0x0)) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    QVar9.d = p0.super_QPromiseBase<int>.m_d.d;
    lVar15 = lVar15 + -0x10;
  } while (lVar15 != 0);
  bVar11 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     (&(p0.super_QPromiseBase<int>.m_d.d)->
                       super_PromiseDataBase<int,_void_(const_int_&)>);
  bVar11 = (bool)(~bVar11 &
                 ((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data.
                 _M_exception_object == (void *)0x0);
  resolver.m_d.d._0_1_ = 1;
  local_d0._M_pod_data[0] = bVar11;
  pcVar16 = QTest::toString<bool>((bool *)local_d0._M_pod_data);
  pcVar17 = QTest::toString<bool>((bool *)&resolver);
  cVar10 = QTest::compare_helper
                     (bVar11,"Compared values are not the same",pcVar16,pcVar17,"p0.isFulfilled()",
                      "true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                      ,0x98);
  QVar9 = p1.super_QPromiseBase<int>.m_d;
  if (cVar10 != '\0') {
    bVar11 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                       (&(p1.super_QPromiseBase<int>.m_d.d)->
                         super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar11 = (bool)(~bVar11 &
                   ((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data.
                   _M_exception_object == (void *)0x0);
    resolver.m_d.d._0_1_ = 1;
    local_d0._M_pod_data[0] = bVar11;
    pcVar16 = QTest::toString<bool>((bool *)local_d0._M_pod_data);
    pcVar17 = QTest::toString<bool>((bool *)&resolver);
    cVar10 = QTest::compare_helper
                       (bVar11,"Compared values are not the same",pcVar16,pcVar17,"p1.isFulfilled()"
                        ,"true",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                        ,0x99);
    if (cVar10 != '\0') {
      bVar11 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                         (&local_e0->super_PromiseDataBase<int,_void_(const_int_&)>);
      resolver.m_d.d._0_1_ = 1;
      local_d0._M_pod_data[0] = bVar11;
      pcVar16 = QTest::toString<bool>((bool *)local_d0._M_pod_data);
      pcVar17 = QTest::toString<bool>((bool *)&resolver);
      cVar10 = QTest::compare_helper
                         (bVar11,"Compared values are not the same",pcVar16,pcVar17,"p2.isPending()"
                          ,"true",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                          ,0x9a);
      if (cVar10 != '\0') {
        bVar11 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                           (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                             super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
        resolver.m_d.d._0_1_ = 1;
        local_d0._M_pod_data[0] = bVar11;
        pcVar16 = QTest::toString<bool>((bool *)local_d0._M_pod_data);
        pcVar17 = QTest::toString<bool>((bool *)&resolver);
        reject = "p.isPending()";
        cVar10 = QTest::compare_helper
                           (bVar11,"Compared values are not the same",pcVar16,pcVar17,
                            "p.isPending()","true",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                            ,0x9b);
        if (cVar10 != '\0') {
          local_58 = (QArrayData *)0x0;
          psStack_50 = (storage_type_conflict *)0x0;
          local_48 = 0;
          this_01 = (PromiseData<QList<int>_> *)operator_new(0x68);
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
          _vptr_PromiseDataBase = (_func_int **)0x0;
          *(undefined8 *)
           &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData = 0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
          _M_exception_object = (void *)0x0;
          (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size
               = 0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size
               = 0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
               (Data *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
               (Data *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
          *(undefined8 *)
           &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
          *(undefined8 *)
           &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = 0;
          (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
          _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012dac8;
          QReadWriteLock::QReadWriteLock
                    (&(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock
                     ,0);
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
               (Data *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size
               = 0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
               (Data *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size
               = 0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
          _M_exception_object = (void *)0x0;
          (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
          _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0012da60;
          (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          LOCK();
          pQVar20 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
                     super_QSharedData;
          (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          pQVar20 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
                     super_QSharedData;
          (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQVar20 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
                     super_QSharedData;
          local_a0.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
               (_func_int **)&PTR__QPromiseBase_0012da28;
          local_a0.super_QPromiseBase<QList<int>_>.m_d.d = this_01;
          QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver(&resolver_1,&local_a0);
          local_a0.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
               (_func_int **)&PTR__QPromiseBase_0012d8c0;
          if (local_a0.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
            LOCK();
            pQVar1 = &((local_a0.super_QPromiseBase<QList<int>_>.m_d.d)->
                      super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
                      super_QSharedData;
            (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i == 0) &&
               (local_a0.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0))
            {
              (*((local_a0.super_QPromiseBase<QList<int>_>.m_d.d)->
                super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase
                [1])();
            }
          }
          QVar8.d = p.super_QPromiseBase<QList<int>_>.m_d.d;
          if (resolver_1.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
            UNLOCK();
          }
          local_120 = resolver_1.m_d.d;
          if (resolver_1.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
            UNLOCK();
          }
          local_d8 = resolver_1.m_d.d;
          QtPromisePrivate::PromiseHandler<QList<int>,decltype(nullptr),void>::
          create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
                    ((function<void_(const_QList<int>_&)> *)&local_d0,
                     (PromiseHandler<QList<int>,decltype(nullptr),void> *)0x0,&local_120,
                     (QPromiseResolve<QList<int>_> *)&local_d8,(QPromiseReject<QList<int>_> *)reject
                    );
          QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
                    (&(QVar8.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
                     (function<void_(const_QList<int>_&)> *)&local_d0);
          if (local_c0 != (undefined **)0x0) {
            (*(code *)local_c0)(&local_d0,&local_d0,__destroy_functor);
          }
          QVar6.d = local_d8.d;
          QVar4.d = local_120.d;
          if (local_120.d != (Data *)0x0) {
            LOCK();
            ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (local_d8.d != (Data *)0x0) {
            LOCK();
            *(int *)&((QPromiseBase<int> *)&(local_d8.d)->super_QSharedData)->_vptr_QPromiseBase =
                 *(int *)&((QPromiseBase<int> *)&(local_d8.d)->super_QSharedData)->
                          _vptr_QPromiseBase + 1;
            UNLOCK();
          }
          resolver.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
               (Data *)0x0;
          resolver.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
               operator_new(0x18);
          *(Data **)resolver.m_d.d = QVar4.d;
          if (QVar4.d != (Data *)0x0) {
            LOCK();
            ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)QVar6.d;
          if (QVar6.d == (Data *)0x0) {
            *(QArrayData ***)((long)resolver.m_d.d + 0x10) = &local_58;
          }
          else {
            LOCK();
            *(int *)&((QPromiseBase<int> *)&(QVar6.d)->super_QSharedData)->_vptr_QPromiseBase =
                 *(int *)&((QPromiseBase<int> *)&(QVar6.d)->super_QSharedData)->_vptr_QPromiseBase +
                 1;
            UNLOCK();
            *(QArrayData ***)((long)resolver.m_d.d + 0x10) = &local_58;
            LOCK();
            *(int *)&((QPromiseBase<int> *)&(QVar6.d)->super_QSharedData)->_vptr_QPromiseBase =
                 *(int *)&((QPromiseBase<int> *)&(QVar6.d)->super_QSharedData)->_vptr_QPromiseBase +
                 -1;
            UNLOCK();
            if (*(int *)&((QPromiseBase<int> *)&(QVar6.d)->super_QSharedData)->_vptr_QPromiseBase ==
                0) {
              operator_delete(QVar6.d,0x10);
            }
          }
          if (QVar4.d != (Data *)0x0) {
            LOCK();
            ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
              operator_delete(QVar4.d,0x10);
            }
          }
          QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
                    (&(QVar8.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
                     (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
          std::
          _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
          ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
          if (local_d8.d != (Data *)0x0) {
            LOCK();
            *(int *)&((QPromiseBase<int> *)&(local_d8.d)->super_QSharedData)->_vptr_QPromiseBase =
                 *(int *)&((QPromiseBase<int> *)&(local_d8.d)->super_QSharedData)->
                          _vptr_QPromiseBase + -1;
            UNLOCK();
            if ((*(int *)&((QPromiseBase<int> *)&(local_d8.d)->super_QSharedData)->
                          _vptr_QPromiseBase == 0) && (local_d8.d != (Data *)0x0)) {
              operator_delete(local_d8.d,0x10);
            }
          }
          if (local_120.d != (Data *)0x0) {
            LOCK();
            ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
               (local_120.d != (Data *)0x0)) {
              operator_delete(local_120.d,0x10);
            }
          }
          if (resolver_1.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
            UNLOCK();
            if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
              operator_delete((void *)resolver_1.m_d.d,0x10);
            }
          }
          QVar8.d = p.super_QPromiseBase<QList<int>_>.m_d.d;
          bVar11 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::
                   isPending(&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
          if (!bVar11) {
            QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
                      (&(QVar8.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
          }
          bVar11 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::
                   isPending((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_01);
          while (bVar11 != false) {
            QCoreApplication::processEvents();
            QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
            bVar11 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::
                     isPending((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_01);
          }
          LOCK();
          (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            (*(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              _vptr_PromiseDataBase[1])(this_01);
          }
          LOCK();
          (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            (*(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              _vptr_PromiseDataBase[1])(this_01);
          }
          QVar21.m_data = (storage_type *)0x3;
          QVar21.m_size = (qsizetype)&local_a0;
          QString::fromUtf8(QVar21);
          pp_Var7 = local_a0.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase;
          QVar22.m_data = psStack_50;
          QVar22.m_size = local_48;
          QVar23.m_data = (storage_type_conflict *)local_a0.super_QPromiseBase<QList<int>_>.m_d.d;
          QVar23.m_size = local_90;
          cVar10 = QTest::qCompare(QVar22,QVar23,"waitForError(p, QString{})","QString{\"foo\"}",
                                   "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                   ,0x9c);
          if ((QArrayData *)pp_Var7 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)pp_Var7)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)pp_Var7)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)pp_Var7)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)pp_Var7,2,8);
            }
          }
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,2,8);
            }
          }
          pPVar12 = local_e0;
          if (cVar10 != '\0') {
            bVar11 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                               (&local_e0->super_PromiseDataBase<int,_void_(const_int_&)>);
            bVar11 = (bool)(~bVar11 &
                           (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data.
                           _M_exception_object != (void *)0x0);
            local_a0.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
                 (_func_int **)
                 CONCAT71(local_a0.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase._1_7_,bVar11);
            local_58 = (QArrayData *)CONCAT71(local_58._1_7_,1);
            pcVar16 = QTest::toString<bool>((bool *)&local_a0);
            pcVar17 = QTest::toString<bool>((bool *)&local_58);
            QTest::compare_helper
                      (bVar11,"Compared values are not the same",pcVar16,pcVar17,"p2.isRejected()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x9d);
          }
        }
      }
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d8c0;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar20 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
               super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  LOCK();
  (local_38->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_38->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_38->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(local_e0->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar20 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar20 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar20->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject()
{
    auto p0 = QtPromise::resolve(42);
    auto p1 = QtPromise::resolve(44);
    auto p2 = QtPromise::QPromise<int>{
        [](const QtPromise::QPromiseResolve<int>&, const QtPromise::QPromiseReject<int>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p2.isRejected(), true);
}